

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O3

void google::protobuf::internal::ExtensionSet::RegisterEnumExtension
               (MessageLite *extendee,int number,FieldType type,bool is_repeated,bool is_packed,
               uint32_t *validation_data)

{
  undefined3 in_register_00000011;
  undefined4 in_register_00000034;
  MessageLite *local_30;
  int local_28;
  undefined1 local_24;
  undefined1 local_23;
  undefined1 local_22;
  undefined8 local_21;
  undefined1 uStack_19;
  undefined7 uStack_18;
  undefined1 uStack_11;
  undefined7 uStack_10;
  undefined8 uStack_9;
  undefined1 local_1;
  
  if (CONCAT31(in_register_00000011,type) == 0xe) {
    local_24 = 0xe;
    local_21 = 0;
    uStack_19 = 0;
    uStack_10 = 0;
    uStack_9 = 0;
    local_1 = 0;
    uStack_18 = SUB87(validation_data,0);
    uStack_11 = (undefined1)((ulong)validation_data >> 0x38);
    local_30 = extendee;
    local_28 = number;
    local_23 = is_repeated;
    local_22 = is_packed;
    anon_unknown_59::Register
              ((anon_unknown_59 *)&local_30,(ExtensionInfo *)CONCAT44(in_register_00000034,number));
    return;
  }
  RegisterEnumExtension();
}

Assistant:

void ExtensionSet::RegisterEnumExtension(const MessageLite* extendee,
                                         int number, FieldType type,
                                         bool is_repeated, bool is_packed,
                                         const uint32_t* validation_data) {
  ABSL_CHECK_EQ(type, WireFormatLite::TYPE_ENUM);
  ExtensionInfo info(extendee, number, type, is_repeated, is_packed);
  info.enum_validity_check.func = nullptr;
  info.enum_validity_check.arg = validation_data;
  Register(info);
}